

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<float>_>::QRotationGate2
          (QRotationGate2<std::complex<float>_> *this,int *qubits,rotation_type *rot,bool fixed)

{
  bool fixed_local;
  rotation_type *rot_local;
  int *qubits_local;
  QRotationGate2<std::complex<float>_> *this_local;
  
  QGate2<std::complex<float>_>::QGate2(&this->super_QGate2<std::complex<float>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,fixed);
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00758b10;
  (this->rotation_).angle_ = rot->angle_;
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[6])
            (this,qubits);
  return;
}

Assistant:

QRotationGate2( const int* qubits , const rotation_type& rot ,
                        const bool fixed = false )
        : rotation_( rot )
        , QAdjustable( fixed )
        {
          setQubits( qubits ) ;
        }